

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

MessageOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::MessageOptions>
          (Tables *this,MessageOptions *param_1)

{
  MessageOptions *this_00;
  MessageOptions *local_38 [3];
  MessageOptions *local_20;
  MessageOptions *result;
  MessageOptions *param_1_local;
  Tables *this_local;
  
  result = param_1;
  param_1_local = (MessageOptions *)this;
  this_00 = (MessageOptions *)operator_new(0x70);
  MessageOptions::MessageOptions(this_00);
  local_38[0] = this_00;
  local_20 = this_00;
  std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::push_back
            (&this->messages_,(value_type *)local_38);
  return local_20;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.push_back(result);
  return result;
}